

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O1

void __thiscall btSoftBody::initializeFaceTree(btSoftBody *this)

{
  Face *data;
  ulong uVar1;
  ulong uVar2;
  Node *pNVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int i;
  long lVar6;
  btDbvtNode *pbVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  float fVar15;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  btDbvtVolume vol;
  btDbvtVolume local_68;
  btVector3 *local_48 [3];
  
  btDbvt::clear(&this->m_fdbvt);
  if (0 < (this->m_faces).m_size) {
    lVar8 = 0;
    do {
      data = (this->m_faces).m_data + lVar8;
      pNVar3 = data->m_n[0];
      local_48[0] = &pNVar3->m_x;
      local_48[1] = &data->m_n[1]->m_x;
      local_48[2] = &data->m_n[2]->m_x;
      uVar4 = *(undefined8 *)(pNVar3->m_x).m_floats;
      uVar5 = *(undefined8 *)((pNVar3->m_x).m_floats + 2);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = *(ulong *)(pNVar3->m_x).m_floats;
      local_68.mi.m_floats[2] = (btScalar)uVar5;
      local_68.mi.m_floats[3] = (btScalar)((ulong)uVar5 >> 0x20);
      local_68.mx.m_floats[0] = (btScalar)uVar4;
      local_68.mx.m_floats[1] = (btScalar)((ulong)uVar4 >> 0x20);
      lVar6 = 1;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = *(ulong *)((pNVar3->m_x).m_floats + 2);
      do {
        uVar1 = *(ulong *)local_48[lVar6]->m_floats;
        auVar16._8_8_ = 0;
        auVar16._0_8_ = uVar1;
        uVar2 = *(ulong *)(local_48[lVar6]->m_floats + 2);
        auVar13._8_8_ = 0;
        auVar13._0_8_ = uVar2;
        fVar15 = (float)(uVar2 >> 0x20);
        fVar18 = (float)(uVar1 >> 0x20);
        auVar17 = minps(auVar16,auVar17);
        uVar9 = -(uint)((float)uVar2 < local_68.mi.m_floats[2]);
        uVar10 = -(uint)(fVar15 < local_68.mi.m_floats[3]);
        uVar11 = -(uint)(local_68.mx.m_floats[0] < (float)uVar1);
        uVar12 = -(uint)(local_68.mx.m_floats[1] < fVar18);
        local_68.mi.m_floats[2] =
             (btScalar)(~uVar9 & (uint)local_68.mi.m_floats[2] | (uint)(float)uVar2 & uVar9);
        local_68.mi.m_floats[3] =
             (btScalar)(~uVar10 & (uint)local_68.mi.m_floats[3] | (uint)fVar15 & uVar10);
        local_68.mx.m_floats[0] =
             (btScalar)(~uVar11 & (uint)local_68.mx.m_floats[0] | (uint)(float)uVar1 & uVar11);
        local_68.mx.m_floats[1] =
             (btScalar)(~uVar12 & (uint)local_68.mx.m_floats[1] | (uint)fVar18 & uVar12);
        auVar14 = maxps(auVar13,auVar14);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      local_68.mi.m_floats._0_8_ = auVar17._0_8_;
      local_68.mx.m_floats[0] = local_68.mx.m_floats[0] + 0.0;
      local_68.mx.m_floats[1] = local_68.mx.m_floats[1] + 0.0;
      local_68.mx.m_floats[3] = auVar14._4_4_;
      local_68.mx.m_floats[2] = auVar14._0_4_ + 0.0;
      pbVar7 = btDbvt::insert(&this->m_fdbvt,&local_68,data);
      data->m_leaf = pbVar7;
      lVar8 = lVar8 + 1;
    } while (lVar8 < (this->m_faces).m_size);
  }
  return;
}

Assistant:

void			btSoftBody::initializeFaceTree()
{
	m_fdbvt.clear();
	for(int i=0;i<m_faces.size();++i)
	{
		Face&	f=m_faces[i];
		f.m_leaf=m_fdbvt.insert(VolumeOf(f,0),&f);
	}
}